

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::uhugeint_t,short,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>>
               (uhugeint_t *ldata,short *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ValidityMask *pVVar5;
  short sVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  uint64_t *puVar8;
  ValidityMask *pVVar9;
  void *pvVar10;
  ValidityMask *pVVar11;
  ulong uVar12;
  uhugeint_t input;
  uhugeint_t input_00;
  uhugeint_t input_01;
  uint64_t *local_90;
  ulong local_70;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_90 = &ldata->upper;
      pVVar9 = (ValidityMask *)0x0;
      pvVar10 = dataptr;
      do {
        input.upper = (uint64_t)result_mask;
        input.lower = *local_90;
        sVar6 = VectorDecimalCastOperator<duckdb::TryCastToDecimal>::
                Operation<duckdb::uhugeint_t,short>
                          ((VectorDecimalCastOperator<duckdb::TryCastToDecimal> *)
                           ((uhugeint_t *)(local_90 + -1))->lower,input,pVVar9,(idx_t)dataptr,
                           pvVar10);
        result_data[(long)pVVar9] = sVar6;
        pVVar9 = (ValidityMask *)
                 ((long)&(pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
        local_90 = local_90 + 2;
      } while ((ValidityMask *)count != pVVar9);
    }
  }
  else {
    pvVar10 = dataptr;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var4 = p_Stack_40;
      peVar3 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      pVVar9 = (ValidityMask *)0x0;
      local_70 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          pVVar11 = pVVar9 + 2;
          if (count <= pVVar9 + 2) {
            pVVar11 = (ValidityMask *)count;
          }
LAB_008b628b:
          pVVar5 = pVVar9;
          if (pVVar9 < pVVar11) {
            puVar8 = &ldata[(long)pVVar9].upper;
            do {
              input_00.upper = (uint64_t)result_mask;
              input_00.lower = *puVar8;
              sVar6 = VectorDecimalCastOperator<duckdb::TryCastToDecimal>::
                      Operation<duckdb::uhugeint_t,short>
                                ((VectorDecimalCastOperator<duckdb::TryCastToDecimal> *)
                                 ((uhugeint_t *)(puVar8 + -1))->lower,input_00,pVVar9,(idx_t)dataptr
                                 ,pvVar10);
              result_data[(long)pVVar9] = sVar6;
              pVVar9 = (ValidityMask *)
                       ((long)&(pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                       1);
              puVar8 = puVar8 + 2;
              pVVar5 = pVVar11;
            } while (pVVar11 != pVVar9);
          }
        }
        else {
          uVar2 = puVar1[local_70];
          pVVar11 = pVVar9 + 2;
          if (count <= pVVar9 + 2) {
            pVVar11 = (ValidityMask *)count;
          }
          pVVar5 = pVVar11;
          if (uVar2 != 0) {
            if (uVar2 == 0xffffffffffffffff) goto LAB_008b628b;
            pVVar5 = pVVar9;
            if (pVVar9 < pVVar11) {
              puVar8 = &ldata[(long)pVVar9].upper;
              uVar12 = 0;
              do {
                if ((uVar2 >> (uVar12 & 0x3f) & 1) != 0) {
                  input_01.upper = (uint64_t)result_mask;
                  input_01.lower = *puVar8;
                  sVar6 = VectorDecimalCastOperator<duckdb::TryCastToDecimal>::
                          Operation<duckdb::uhugeint_t,short>
                                    ((VectorDecimalCastOperator<duckdb::TryCastToDecimal> *)
                                     ((uhugeint_t *)(puVar8 + -1))->lower,input_01,
                                     (ValidityMask *)
                                     ((long)&(pVVar9->super_TemplatedValidityMask<unsigned_long>).
                                             validity_mask + uVar12),(idx_t)dataptr,pvVar10);
                  result_data
                  [(long)((long)&(pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask
                         + uVar12)] = sVar6;
                }
                uVar12 = uVar12 + 1;
                puVar8 = puVar8 + 2;
                pVVar5 = pVVar11;
              } while ((long)pVVar11 - (long)pVVar9 != uVar12);
            }
          }
        }
        pVVar9 = pVVar5;
        local_70 = local_70 + 1;
      } while (local_70 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}